

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.c
# Opt level: O2

void do_alias(CHAR_DATA *ch,char *argument)

{
  char *bstr;
  bool bVar1;
  char *pcVar2;
  long lVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  char *pcVar4;
  long lVar5;
  CHAR_DATA *ch_00;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string buffer;
  string local_2478;
  char *local_2458 [2];
  char *local_2448;
  char arg [4608];
  char buf [4608];
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  smash_tilde(argument);
  ch_00 = ch;
  if ((ch->desc != (DESCRIPTOR_DATA *)0x0) &&
     (ch_00 = ch->desc->original, ch_00 == (CHAR_DATA *)0x0)) {
    ch_00 = ch;
  }
  bVar1 = is_npc(ch_00);
  if (bVar1) goto LAB_002d16b2;
  pcVar2 = one_argument(argument,arg);
  if (arg[0] == '\0') {
    if (ch_00->pcdata->alias[0] != (char *)0x0) {
      send_to_char("Your current aliases are:\n\r",ch);
      for (lVar3 = -0x50; lVar3 != 0; lVar3 = lVar3 + 8) {
        if ((*(long *)((long)ch_00->pcdata->alias_sub + lVar3) == 0) ||
           (*(long *)((long)ch_00->pcdata->color_scheme + lVar3 + -0x38) == 0)) break;
        sprintf(buf,"    %s:  %s\n\r");
        send_to_char(buf,ch);
      }
      goto LAB_002d16b2;
    }
    pcVar4 = "You have no aliases defined.\n\r";
  }
  else {
    bVar1 = str_prefix("una",arg);
    pcVar4 = "Sorry, that word is reserved.\n\r";
    if (bVar1) {
      bVar1 = str_cmp("alias",arg);
      if (bVar1) {
        if (*pcVar2 == '\0') {
          pcVar4 = "That alias is not defined.\n\r";
          lVar3 = -10;
          do {
            lVar5 = lVar3;
            if (lVar5 == 0) goto LAB_002d173f;
            pcVar2 = ch_00->pcdata->alias_sub[lVar5];
            if ((pcVar2 == (char *)0x0) || (ch_00->pcdata->color_scheme[lVar5 + -7] == (char *)0x0))
            goto LAB_002d173f;
            bVar1 = str_cmp(arg,pcVar2);
            lVar3 = lVar5 + 1;
          } while (bVar1);
          pcVar4 = buf;
          sprintf(pcVar4,"%s aliases to \'%s\'.\n\r",ch_00->pcdata->alias_sub[lVar5],
                  ch_00->pcdata->color_scheme[lVar5 + -7]);
LAB_002d173f:
          send_to_char(pcVar4,ch);
          goto LAB_002d16b2;
        }
        bVar1 = str_prefix(pcVar2,"delete");
        pcVar4 = "That shall not be done!\n\r";
        if (bVar1) {
          bVar1 = str_prefix(pcVar2,"prefix");
          if (bVar1) {
            pcVar4 = "Sorry, you have reached the alias limit.\n\r";
            for (lVar3 = 0; lVar3 != 0x50; lVar3 = lVar3 + 8) {
              bstr = *(char **)((long)ch_00->pcdata->alias + lVar3);
              if (bstr == (char *)0x0) {
                pcVar4 = palloc_string(arg);
                *(char **)((long)ch_00->pcdata->alias + lVar3) = pcVar4;
                pcVar4 = palloc_string(pcVar2);
                *(char **)((long)ch_00->pcdata->alias_sub + lVar3) = pcVar4;
                fmt.size_ = 0xcc;
                fmt.data_ = (char *)0x1c;
                args.field_1.args_ = in_R9.args_;
                args.desc_ = (unsigned_long_long)local_2458;
                local_2458[0] = arg;
                local_2448 = pcVar2;
                ::fmt::v9::vformat_abi_cxx11_
                          (&local_2478,(v9 *)"{} is now aliased to \'{}\'.\n\r",fmt,args);
LAB_002d17f9:
                std::__cxx11::string::operator=((string *)&buffer,(string *)&local_2478);
                std::__cxx11::string::~string((string *)&local_2478);
                send_to_char(buffer._M_dataplus._M_p,ch);
                goto LAB_002d16b2;
              }
              bVar1 = str_cmp(arg,bstr);
              if (!bVar1) {
                free_pstring(*(char **)((long)ch_00->pcdata->alias_sub + lVar3));
                pcVar4 = palloc_string(pcVar2);
                *(char **)((long)ch_00->pcdata->alias_sub + lVar3) = pcVar4;
                fmt_00.size_ = 0xcc;
                fmt_00.data_ = (char *)0x1e;
                args_00.field_1.args_ = in_R9.args_;
                args_00.desc_ = (unsigned_long_long)local_2458;
                local_2458[0] = arg;
                local_2448 = pcVar2;
                ::fmt::v9::vformat_abi_cxx11_
                          (&local_2478,(v9 *)"{} is now realiased to \'{}\'.\n\r",fmt_00,args_00);
                goto LAB_002d17f9;
              }
            }
            goto LAB_002d173f;
          }
        }
      }
    }
  }
  send_to_char(pcVar4,ch);
LAB_002d16b2:
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

void do_alias(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *rch;
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	std::string buffer;
	int pos;
	smash_tilde(argument);

	if (ch->desc == nullptr)
		rch = ch;
	else
		rch = ch->desc->original ? ch->desc->original : ch;

	if (is_npc(rch))
		return;

	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		if (rch->pcdata->alias[0] == nullptr)
		{
			send_to_char("You have no aliases defined.\n\r", ch);
			return;
		}

		send_to_char("Your current aliases are:\n\r", ch);

		for (pos = 0; pos < MAX_ALIAS; pos++)
		{
			if (rch->pcdata->alias[pos] == nullptr || rch->pcdata->alias_sub[pos] == nullptr)
				break;

			sprintf(buf, "    %s:  %s\n\r", rch->pcdata->alias[pos], rch->pcdata->alias_sub[pos]);
			send_to_char(buf, ch);
		}

		return;
	}

	if (!str_prefix("una", arg) || !str_cmp("alias", arg))
	{
		send_to_char("Sorry, that word is reserved.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		for (pos = 0; pos < MAX_ALIAS; pos++)
		{
			if (rch->pcdata->alias[pos] == nullptr || rch->pcdata->alias_sub[pos] == nullptr)
				break;

			if (!str_cmp(arg, rch->pcdata->alias[pos]))
			{
				sprintf(buf, "%s aliases to '%s'.\n\r", rch->pcdata->alias[pos], rch->pcdata->alias_sub[pos]);
				send_to_char(buf, ch);
				return;
			}
		}

		send_to_char("That alias is not defined.\n\r", ch);
		return;
	}

	if (!str_prefix(argument, "delete") || !str_prefix(argument, "prefix"))
	{
		send_to_char("That shall not be done!\n\r", ch);
		return;
	}

	for (pos = 0; pos < MAX_ALIAS; pos++)
	{
		if (rch->pcdata->alias[pos] == nullptr)
			break;

		if (!str_cmp(arg, rch->pcdata->alias[pos])) /* redefine an alias */
		{
			free_pstring(rch->pcdata->alias_sub[pos]);
			rch->pcdata->alias_sub[pos] = palloc_string(argument);

			buffer = fmt::format("{} is now realiased to '{}'.\n\r", arg, argument); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);
			return;
		}
	}

	if (pos >= MAX_ALIAS)
	{
		send_to_char("Sorry, you have reached the alias limit.\n\r", ch);
		return;
	}

	/* make a new alias */
	rch->pcdata->alias[pos] = palloc_string(arg);
	rch->pcdata->alias_sub[pos] = palloc_string(argument);

	buffer = fmt::format("{} is now aliased to '{}'.\n\r", arg, argument);
	send_to_char(buffer.c_str(), ch);
}